

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O3

void __thiscall
Pl_Function::Pl_Function(Pl_Function *this,char *identifier,Pipeline *next,writer_t *fn)

{
  function<void_(const_unsigned_char_*,_unsigned_long)> *this_00;
  _Any_data _Stack_38;
  code *local_28;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Function_002ea548;
  this_00 = (function<void_(const_unsigned_char_*,_unsigned_long)> *)operator_new(0x20);
  std::function<void_(const_unsigned_char_*,_unsigned_long)>::function
            ((function<void_(const_unsigned_char_*,_unsigned_long)> *)&_Stack_38,fn);
  std::function<void_(const_unsigned_char_*,_unsigned_long)>::function
            (this_00,(function<void_(const_unsigned_char_*,_unsigned_long)> *)&_Stack_38);
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>.
  super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl = (Members *)this_00;
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return;
}

Assistant:

Pl_Function::Pl_Function(char const* identifier, Pipeline* next, writer_t fn) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(fn))
{
}